

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>::~Stack
          (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *this)

{
  pair<Kernel::TermSpec,_Kernel::RealConstantType> *ppVar1;
  
  for (ppVar1 = this->_cursor; ppVar1 != this->_stack; ppVar1 = ppVar1 + -1) {
    Kernel::RationalConstantType::~RationalConstantType
              (&ppVar1[-1].second.super_RationalConstantType);
  }
  if (ppVar1 != (pair<Kernel::TermSpec,_Kernel::RealConstantType> *)0x0) {
    Lib::free(this->_stack);
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }